

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O0

void Inta_ManFree(Inta_Man_t *p)

{
  Inta_Man_t *p_local;
  
  if (p->pInters != (Aig_Obj_t **)0x0) {
    free(p->pInters);
    p->pInters = (Aig_Obj_t **)0x0;
  }
  if (p->pProofNums != (int *)0x0) {
    free(p->pProofNums);
    p->pProofNums = (int *)0x0;
  }
  if (p->pTrail != (lit *)0x0) {
    free(p->pTrail);
    p->pTrail = (lit *)0x0;
  }
  if (p->pAssigns != (lit *)0x0) {
    free(p->pAssigns);
    p->pAssigns = (lit *)0x0;
  }
  if (p->pSeens != (char *)0x0) {
    free(p->pSeens);
    p->pSeens = (char *)0x0;
  }
  if (p->pVarTypes != (int *)0x0) {
    free(p->pVarTypes);
    p->pVarTypes = (int *)0x0;
  }
  if (p->pReasons != (Sto_Cls_t **)0x0) {
    free(p->pReasons);
    p->pReasons = (Sto_Cls_t **)0x0;
  }
  if (p->pWatches != (Sto_Cls_t **)0x0) {
    free(p->pWatches);
    p->pWatches = (Sto_Cls_t **)0x0;
  }
  Vec_IntFree(p->vResLits);
  if (p != (Inta_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Inta_ManFree( Inta_Man_t * p )
{
/*
    printf( "Runtime stats:\n" );
ABC_PRT( "BCP     ", p->timeBcp   );
ABC_PRT( "Trace   ", p->timeTrace );
ABC_PRT( "TOTAL   ", p->timeTotal );
*/
    ABC_FREE( p->pInters );
    ABC_FREE( p->pProofNums );
    ABC_FREE( p->pTrail );
    ABC_FREE( p->pAssigns );
    ABC_FREE( p->pSeens );
    ABC_FREE( p->pVarTypes );
    ABC_FREE( p->pReasons );
    ABC_FREE( p->pWatches );
    Vec_IntFree( p->vResLits );
    ABC_FREE( p );
}